

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

vec<double,_4> * __thiscall
linalg::slerp<double,4>
          (vec<double,_4> *__return_storage_ptr__,linalg *this,vec<double,_4> *a,vec<double,_4> *b,
          double t)

{
  vec<double,_4> *a_00;
  double dVar1;
  double dVar2;
  double local_78;
  no_mm_apply_t<detail::op_mul,_linalg::vec<double,_4>,_double> local_70;
  double local_50;
  no_mm_apply_t<detail::op_mul,_linalg::vec<double,_4>,_double> local_48;
  double local_28;
  double th;
  double t_local;
  vec<double,_4> *b_local;
  vec<double,_4> *a_local;
  
  th = t;
  t_local = (double)a;
  b_local = (vec<double,_4> *)this;
  local_28 = uangle<double,4>((vec<double,_4> *)this,a);
  a_00 = b_local;
  if ((local_28 != 0.0) || (NAN(local_28))) {
    dVar1 = sin(local_28 * (1.0 - th));
    local_50 = sin(local_28);
    local_50 = dVar1 / local_50;
    operator*(&local_48,a_00,&local_50);
    dVar1 = t_local;
    dVar2 = sin(local_28 * th);
    local_78 = sin(local_28);
    local_78 = dVar2 / local_78;
    operator*(&local_70,(vec<double,_4> *)dVar1,&local_78);
    operator+(__return_storage_ptr__,&local_48,&local_70);
  }
  else {
    __return_storage_ptr__->x = b_local->x;
    __return_storage_ptr__->y = b_local->y;
    __return_storage_ptr__->z = b_local->z;
    __return_storage_ptr__->w = b_local->w;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr vec<T,4> qconj(const vec<T,4> & q)                     { return {-q.x,-q.y,-q.z,q.w}; }